

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  ulong uVar1;
  pointer pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  char *pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  iterator piter;
  char *local_80;
  const_iterator local_78;
  char *local_70;
  iterator local_68;
  
  if (((((this->_path)._M_string_length < 3) ||
       (pcVar6 = (this->_path)._M_dataplus._M_p, *pcVar6 != '/')) || (pcVar6[1] != '/')) ||
     ((pcVar6[2] == 0x2f || (iVar3 = isprint((int)pcVar6[2]), iVar3 == 0)))) {
    sVar4 = 0;
  }
  else {
    sVar4 = std::__cxx11::string::find((char)this,0x2f);
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = (this->_path)._M_string_length;
    }
  }
  if ((((this->_path)._M_string_length < 3) ||
      (pcVar6 = (this->_path)._M_dataplus._M_p, *pcVar6 != '/')) ||
     ((pcVar6[1] != '/' || ((pcVar6[2] == 0x2f || (iVar3 = isprint((int)pcVar6[2]), iVar3 == 0))))))
  {
    uVar5 = 0;
  }
  else {
    uVar5 = std::__cxx11::string::find((char)this,0x2f);
    if (uVar5 == 0xffffffffffffffff) {
      uVar5 = (this->_path)._M_string_length;
    }
  }
  uVar1 = (this->_path)._M_string_length;
  if (uVar5 < uVar1) {
    uVar5 = (ulong)((this->_path)._M_dataplus._M_p[uVar5] == '/');
  }
  else {
    uVar5 = 0;
  }
  if (uVar5 + sVar4 < uVar1) {
    local_78._M_current = (this->_path)._M_dataplus._M_p + uVar1;
    iterator::iterator(&local_68,this,&local_78);
    pcVar6 = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    last._M_current = pcVar6;
    if (((local_68._first._M_current != pcVar6) &&
        (last._M_current = pcVar6 + -1, last._M_current != local_68._root._M_current)) &&
       ((pcVar6 != local_68._last._M_current || (*last._M_current != '/')))) {
      local_70 = local_68._first._M_current;
      local_78._M_current = last._M_current;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                (&local_80,&local_78,&local_70,&path_helper_base<char>::preferred_separator);
      last._M_current = local_80;
      if (((long)local_80 - (long)local_68._first._M_current == 2) &&
         (*local_68._first._M_current == '/')) {
        last._M_current = local_80 + (ulong)(local_68._first._M_current[1] != '/') * 2 + -2;
      }
    }
    first._M_current = (this->_path)._M_dataplus._M_p;
    if (first._M_current + uVar5 + sVar4 < last._M_current) {
      last._M_current = last._M_current + -(ulong)(*last._M_current != '/');
    }
    path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,first,last,native_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._current._path._M_dataplus._M_p != &local_68._current._path.field_2) {
      operator_delete(local_68._current._path._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    pcVar2 = (this->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    if (rootPathLen < _path.length()) {
        if (empty()) {
            return path();
        }
        else {
            auto piter = end();
            auto iter = piter.decrement(_path.end());
            if (iter > _path.begin() + static_cast<long>(rootPathLen) && *iter != preferred_separator) {
                --iter;
            }
            return path(_path.begin(), iter, native_format);
        }
    }
    else {
        return *this;
    }
}